

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O0

SUNErrCode SUNProfiler_Print(SUNProfiler p,FILE *fp)

{
  int iVar1;
  SUNErrCode SVar2;
  FILE *in_RSI;
  SUNHashMapKeyValue in_RDI;
  double resolution;
  SUNHashMapKeyValue *sorted;
  sunTimerStruct *timer;
  int rank;
  int i;
  SUNErrCode ier;
  void **in_stack_ffffffffffffffb8;
  sunTimerStruct *in_stack_ffffffffffffffc0;
  SUNProfiler p_00;
  int iVar3;
  SUNErrCode local_4;
  
  p_00 = (SUNProfiler)0x0;
  if (in_RDI == (SUNHashMapKeyValue)0x0) {
    local_4 = -9999;
  }
  else {
    sunStartTiming((sunTimerStruct *)0x1135bb);
    iVar1 = SUNHashMap_GetValue((SUNHashMap)p_00,(char *)in_stack_ffffffffffffffc0,
                                in_stack_ffffffffffffffb8);
    if (iVar1 == -1) {
      local_4 = -0x26fe;
    }
    else if (iVar1 == -2) {
      local_4 = -0x26fc;
    }
    else {
      in_RDI[2].key = pcRam0000000000000020;
      SVar2 = SUNHashMap_Sort((SUNHashMap)p_00,(SUNHashMapKeyValue **)in_stack_ffffffffffffffc0,
                              (_func_int_void_ptr_void_ptr *)in_stack_ffffffffffffffb8);
      if (SVar2 == 0) {
        SUNProfiler_GetTimerResolution(p_00,(double *)in_stack_ffffffffffffffc0);
        fprintf(in_RSI,
                "\n================================================================================================================\n"
               );
        fprintf(in_RSI,"SUNDIALS GIT VERSION: %s\n","v6.4.1-opencor-2-g75f9ebd6c279");
        fprintf(in_RSI,"SUNDIALS PROFILER: %s\n",in_RDI->value);
        fprintf(in_RSI,"TIMER RESOLUTION: %gs\n",in_stack_ffffffffffffffc0);
        fprintf(in_RSI,"%-40s\t %% time (inclusive) \t max/rank \t average/rank \t count \n",
                "RESULTS:");
        fprintf(in_RSI,
                "================================================================================================================\n"
               );
        for (iVar3 = 0; iVar3 < *(int *)in_RDI[1].key; iVar3 = iVar3 + 1) {
          if (*(long *)(&p_00->comm + (long)iVar3 * 2) != 0) {
            sunPrintTimer(in_RDI,(FILE *)in_RSI,(void *)CONCAT44(iVar1,iVar3));
          }
        }
        free(p_00);
        sunStopTiming(in_stack_ffffffffffffffc0);
        fprintf(in_RSI,"%-40s\t %6.2f%% \t         %.6fs \t -- \t\t -- \n",
                *(double *)((long)in_RDI[1].value + 0x20) / (double)in_RDI[2].key,
                *(undefined8 *)((long)in_RDI[1].value + 0x20),"Est. profiler overhead");
        fprintf(in_RSI,"\n");
        local_4 = 0;
      }
      else {
        local_4 = -0x26fb;
      }
    }
  }
  return local_4;
}

Assistant:

SUNErrCode SUNProfiler_Print(SUNProfiler p, FILE* fp)
{
  SUNErrCode ier             = 0;
  int i                      = 0;
  int rank                   = 0;
  sunTimerStruct* timer      = NULL;
  SUNHashMapKeyValue* sorted = NULL;

  if (!p) { return SUN_ERR_ARG_CORRUPT; }

  sunStartTiming(p->overhead);

  /* Get the total SUNDIALS time up to this point */
  SUNDIALS_MARK_END(p, SUNDIALS_ROOT_TIMER);
  SUNDIALS_MARK_BEGIN(p, SUNDIALS_ROOT_TIMER);

  ier = SUNHashMap_GetValue(p->map, SUNDIALS_ROOT_TIMER, (void**)&timer);
  if (ier == -1) { return SUN_ERR_PROFILER_MAPGET; }
  if (ier == -2) { return SUN_ERR_PROFILER_MAPKEYNOTFOUND; }
  p->sundials_time = timer->elapsed;

#if SUNDIALS_MPI_ENABLED
  if (p->comm != SUN_COMM_NULL)
  {
    MPI_Comm_rank(p->comm, &rank);
    /* Find the max and average time across all ranks */
    sunCollectTimers(p);
  }
#endif

  if (rank == 0)
  {
    double resolution;
    /* Sort the timers in descending order */
    if (SUNHashMap_Sort(p->map, &sorted, sunCompareTimes))
    {
      return SUN_ERR_PROFILER_MAPSORT;
    }
    SUNProfiler_GetTimerResolution(p, &resolution);
    fprintf(fp, "\n============================================================"
                "====================================================\n");
    fprintf(fp, "SUNDIALS GIT VERSION: %s\n", SUNDIALS_GIT_VERSION);
    fprintf(fp, "SUNDIALS PROFILER: %s\n", p->title);
    fprintf(fp, "TIMER RESOLUTION: %gs\n", resolution);
    fprintf(fp, "%-40s\t %% time (inclusive) \t max/rank \t average/rank \t count \n",
            "RESULTS:");
    fprintf(fp, "=============================================================="
                "==================================================\n");

#if SUNDIALS_MPI_ENABLED
    if (p->comm == SUN_COMM_NULL)
    {
      printf(
        "WARNING: no MPI communicator provided, times shown are for rank 0\n");
    }
#endif

    /* Print all the other timers out */
    for (i = 0; i < p->map->size; i++)
    {
      if (sorted[i]) { sunPrintTimer(sorted[i], fp, (void*)p); }
    }
    free(sorted);
  }

  sunStopTiming(p->overhead);

  if (rank == 0)
  {
    /* Print out the total time and the profiler overhead */
    fprintf(fp, "%-40s\t %6.2f%% \t         %.6fs \t -- \t\t -- \n",
            "Est. profiler overhead", p->overhead->elapsed / p->sundials_time,
            p->overhead->elapsed);

    /* End of output */
    fprintf(fp, "\n");
  }

  return SUN_SUCCESS;
}